

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_build_obmc_inter_predictors_sb(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  AV1_COMMON *in_RDI;
  int mi_col;
  int mi_row;
  int dst_height2 [3];
  int dst_height1 [3];
  int dst_width2 [3];
  int dst_width1 [3];
  int dst_stride2 [3];
  int dst_stride1 [3];
  uint8_t *dst_buf2 [3];
  uint8_t *dst_buf1 [3];
  int num_planes;
  uint8_t **in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *above_stride;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int plane_start;
  AV1_COMMON *cm_00;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  MACROBLOCKD *in_stack_ffffffffffffffa8;
  AV1_COMMON *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffd0;
  
  av1_num_planes(in_RDI);
  uVar9 = 0x80;
  uVar10 = 0x80;
  uVar11 = 0x80;
  cm_00 = (AV1_COMMON *)0x8000000080;
  uVar8 = 0x80;
  uVar6 = 0x80;
  uVar7 = 0x80;
  plane_start = 0x80;
  above_stride = (int *)0x8000000080;
  uVar5 = 0x80;
  uVar2 = 0x80;
  uVar3 = 0x80;
  uVar4 = 0x80;
  uVar1 = 0x80;
  av1_setup_obmc_dst_bufs
            ((MACROBLOCKD *)0x8000000080,
             (uint8_t **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
  av1_build_prediction_by_above_preds
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint8_t **)CONCAT44(uVar11,uVar10)
             ,(int *)CONCAT44(uVar9,uVar8),(int *)cm_00,(int *)CONCAT44(plane_start,uVar7));
  av1_build_prediction_by_left_preds
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint8_t **)CONCAT44(uVar11,uVar10)
             ,(int *)CONCAT44(uVar9,uVar8),(int *)cm_00,(int *)CONCAT44(plane_start,uVar7));
  av1_setup_dst_planes
            ((macroblockd_plane *)in_stack_ffffffffffffffa8,(BLOCK_SIZE)((uint)uVar11 >> 0x18),
             (YV12_BUFFER_CONFIG *)CONCAT44(uVar9,uVar8),(int)((ulong)cm_00 >> 0x20),(int)cm_00,
             plane_start,in_stack_ffffffffffffffd0);
  av1_build_obmc_inter_prediction
            (cm_00,(MACROBLOCKD *)CONCAT44(plane_start,uVar7),(uint8_t **)CONCAT44(uVar6,uVar5),
             above_stride,(uint8_t **)CONCAT44(uVar4,uVar3),(int *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

void av1_build_obmc_inter_predictors_sb(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  const int num_planes = av1_num_planes(cm);
  uint8_t *dst_buf1[MAX_MB_PLANE], *dst_buf2[MAX_MB_PLANE];
  int dst_stride1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_stride2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_width1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_width2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_height1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_height2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };

  av1_setup_obmc_dst_bufs(xd, dst_buf1, dst_buf2);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  av1_build_prediction_by_above_preds(cm, xd, dst_buf1, dst_width1, dst_height1,
                                      dst_stride1);
  av1_build_prediction_by_left_preds(cm, xd, dst_buf2, dst_width2, dst_height2,
                                     dst_stride2);
  av1_setup_dst_planes(xd->plane, xd->mi[0]->bsize, &cm->cur_frame->buf, mi_row,
                       mi_col, 0, num_planes);
  av1_build_obmc_inter_prediction(cm, xd, dst_buf1, dst_stride1, dst_buf2,
                                  dst_stride2);
}